

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O3

void __thiscall QSQLiteResult::QSQLiteResult(QSQLiteResult *this,QSQLiteDriver *db)

{
  long lVar1;
  QSqlCachedResultPrivate *this_00;
  QPodArrayOps<QSQLiteResult*> *this_01;
  long in_FS_OFFSET;
  QSQLiteResult *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR__QSQLiteResult_00239a20;
  this_00 = (QSqlCachedResultPrivate *)operator_new(0x108);
  QSqlResultPrivate::QSqlResultPrivate
            ((QSqlResultPrivate *)this_00,(QSqlResult *)this,&db->super_QSqlDriver);
  (this_00->cache).d.size = 0;
  this_00->rowCacheEnd = 0;
  this_00->colCount = 0;
  (this_00->cache).d.d = (Data *)0x0;
  (this_00->cache).d.ptr = (QVariant *)0x0;
  this_00->atEnd = false;
  *(undefined ***)this_00 = &PTR__QSQLiteResultPrivate_00239cf0;
  *(undefined8 *)(this_00 + 1) = 0;
  QSqlRecord::QSqlRecord((QSqlRecord *)&this_00[1].field_0x8);
  *(undefined8 *)&this_00[1].field_0x1a = 0;
  *(undefined8 *)&this_00[1].field_0x22 = 0;
  *(undefined8 *)&this_00[1].field_0x10 = 0;
  *(undefined8 *)&this_00[1].field_0x18 = 0;
  QSqlCachedResult::QSqlCachedResult(&this->super_QSqlCachedResult,this_00);
  *(undefined ***)this = &PTR__QSQLiteResult_00239a20;
  lVar1 = *(long *)(*(long *)(*(long *)&this->field_0x8 + 0x18) + 8);
  this_01 = (QPodArrayOps<QSQLiteResult*> *)(lVar1 + 0xb0);
  local_30 = this;
  QtPrivate::QPodArrayOps<QSQLiteResult*>::emplace<QSQLiteResult*&>
            (this_01,*(qsizetype *)(lVar1 + 0xc0),&local_30);
  QList<QSQLiteResult_*>::end((QList<QSQLiteResult_*> *)this_01);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QSQLiteResult::QSQLiteResult(const QSQLiteDriver* db)
    : QSqlCachedResult(*new QSQLiteResultPrivate(this, db))
{
    Q_D(QSQLiteResult);
    const_cast<QSQLiteDriverPrivate*>(d->drv_d_func())->results.append(this);
}